

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# room-words.h
# Opt level: O1

shared_ptr<RoomBase> __thiscall RoomWords::getBash(RoomWords *this,Parameters *parameters)

{
  pointer pcVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  shared_ptr<RoomBase> sVar5;
  shared_ptr<RoomWords> result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  RoomWords *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  local_88 = (RoomWords *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RoomWords,std::allocator<RoomWords>>
            (&local_80,&local_88,(allocator<RoomWords> *)&local_78);
  (local_88->super_RoomBase).mode = Standard;
  std::__cxx11::string::_M_replace
            ((ulong)&(local_88->super_RoomBase).name,0,
             (char *)(local_88->super_RoomBase).name._M_string_length,0x10e61c);
  pcVar1 = (parameters->pathData)._M_dataplus._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + (parameters->pathData)._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  Dictionary::load((Dictionary *)&local_58,&local_78);
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (local_88->dictionary).words.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (local_88->dictionary).words.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (local_88->dictionary).words.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_88->dictionary).words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (local_88->dictionary).words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (local_88->dictionary).words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  (local_88->super_RoomBase).poolSize = 0x20;
  if ((anonymous_namespace)::timestamp_s()::tStart == '\0') {
    getBash();
  }
  lVar3 = std::chrono::_V2::steady_clock::now();
  sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (lVar3 / 1000000 - anon_unknown.dwarf_113e3::timestamp_s::tStart);
  auVar4._8_4_ = (int)((ulong)sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi >> 0x20);
  auVar4._0_8_ = sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  auVar4._12_4_ = 0x45300000;
  dVar2 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,
                            (int)sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi) - 4503599627370496.0)) * 0.001;
  (local_88->super_RoomBase).tCreated_s = dVar2;
  (local_88->super_RoomBase).tRoundLength_s = 60.0;
  (local_88->super_RoomBase).tRoundStart_s = dVar2 + -60.0;
  (this->super_RoomBase)._vptr_RoomBase = (_func_int **)local_88;
  (this->super_RoomBase).id = 0;
  (this->super_RoomBase).mode = Standard;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_RoomBase).id = local_80._M_pi;
  sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_RoomBase;
  return (shared_ptr<RoomBase>)sVar5.super___shared_ptr<RoomBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<RoomBase> getBash(Parameters parameters) {
        auto result = std::make_shared<RoomWords>();

        result->mode = Standard;
        result->name = "Bash";
        result->dictionary = Dictionary::load(parameters.pathData + "words_bash.txt");
        result->poolSize = 32;
        result->tCreated_s = timestamp_s();
        result->tRoundLength_s = 1.0f*60.f;
        result->tRoundStart_s = result->tCreated_s - result->tRoundLength_s;

        return result;
    }